

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::AssertionHandler::complete(AssertionHandler *this)

{
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x3b) = 1;
  if ((*(byte *)(in_RDI + 0x38) & 1) != 0) {
    complete::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)0x184e26);
  }
  if ((*(byte *)(in_RDI + 0x39) & 1) != 0) {
    throw_test_failure_exception();
  }
  if ((*(byte *)(in_RDI + 0x3a) & 1) != 0) {
    throw_test_skip_exception();
  }
  return;
}

Assistant:

void AssertionHandler::complete() {
        m_completed = true;
        if( m_reaction.shouldDebugBreak ) {

            // If you find your debugger stopping you here then go one level up on the
            // call-stack for the code that caused it (typically a failed assertion)

            // (To go back to the test and change execution, jump over the throw, next)
            CATCH_BREAK_INTO_DEBUGGER();
        }
        if (m_reaction.shouldThrow) {
            throw_test_failure_exception();
        }
        if ( m_reaction.shouldSkip ) {
            throw_test_skip_exception();
        }
    }